

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  Handle proc_00;
  bool bVar1;
  ostream *poVar2;
  Handle proc;
  Module libc;
  Handle local_6c;
  Module local_68;
  string local_38;
  
  local_6c = remote::OpenProcess(0x150c);
  bVar1 = remote::Handle::IsRunning(&local_6c);
  proc_00.pid = local_6c.pid;
  if (bVar1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"libpthread-2.19.so","");
    remote::GetModuleHandle(&local_68,proc_00,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (local_68.regions.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl
        .super__Vector_impl_data._M_finish !=
        local_68.regions.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"libc = ",7);
      *(uint *)(process_vm_readv + *(long *)(std::cout + -0x18)) =
           *(uint *)(process_vm_readv + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    std::vector<remote::ModuleSymbol,_std::allocator<remote::ModuleSymbol>_>::~vector
              (&local_68.symbols);
    std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&local_68.regions);
  }
  return 0;
}

Assistant:

int main() {

    remote::Handle proc = remote::OpenProcess(5388);

    if(proc.IsRunning()) {
        remote::Module libc = remote::GetModuleHandle(proc, "libpthread-2.19.so");

        if(libc.IsValid()) {
            // We need to grab symbol list
            cout << "libc = " << hex << libc.GetStart() << endl;
        }

        /*
        std::vector<remote::Region> rs = remote::GetRegions(proc.pid);

        for(size_t i = 0; i < rs.size(); i++) {
            if(!rs[i].filename.empty()) {
                std::cout << "Filename: " << rs[i].filename << std::endl;
            }

            if(!rs[i].pathname.empty()) {
                std::cout << "Path: " << rs[i].pathname << std::endl;
            }

            std::cout << "Start: " << std::hex << rs[i].start << std::endl;
            std::cout << "End: " << std::hex << rs[i].end << std::endl;
            std::cout << "Permissions: " << rs[i].read << rs[i].write << rs[i].exec << rs[i].shared << std::endl;
            std::cout << "Offset: " << std::hex << rs[i].offset << std::endl;
            std::cout << "Device: " << std::dec << rs[i].deviceMajor << ":" << rs[i].deviceMinor << std::endl;
            std::cout << "INode: " << std::dec << rs[i].inodeFileNumber << std::endl;
            std::cout << "-------------------------------------" << std::endl;
        }

        size_t calc_base = proc.GetModuleAddress("gnome-calculator");

        cout << "Calculator Base: " << hex << calc_base << endl;
        */
    }

    return 0;
}